

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O1

void f3b(int (*a) [22])

{
  spin_mutex_t sVar1;
  uint uVar2;
  ostream *poVar3;
  long lVar4;
  
  if ((int)x.super___atomic_base<int>._M_i < 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)((int)x.super___atomic_base<int>._M_i < 8);
  }
  LOCK();
  success_counter.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)success_counter.super___atomic_base<int>._M_i + uVar2);
  UNLOCK();
  inwritemode = true;
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"f3b ",4);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(*a)[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," begin: ",8);
  lVar4 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar4 - (long)t0.__d.__r) / 1000000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  (*a)[0] = (*a)[0] + 1;
  fun(false,600);
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"f3b ",4);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(*a)[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," end: ",6);
  lVar4 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar4 - (long)t0.__d.__r) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n-------------",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  inwritemode = false;
  LOCK();
  x.super___atomic_base<int>._M_i = (__atomic_base<int>)-0x100;
  UNLOCK();
  second_round = true;
  return;
}

Assistant:

void f3b(int (&a)[22])
{ 
  success_counter.fetch_add((x >= 0) && (x < 8)); //f3 must have finished
  inwritemode = true;
  LOG("f3b " << a[0] << " begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  a[0]++;
  fun(false);
  LOG("f3b " << a[0] << " end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << "\n-------------");
  inwritemode = false;
  x = -256;
  second_round = true;
}